

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  uint uVar33;
  undefined1 (*pauVar34) [16];
  long lVar35;
  ulong uVar36;
  RTCRayQueryContext *pRVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined4 uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar67 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar91;
  float fVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar97;
  undefined1 auVar98 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  float fVar120;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar128 [32];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar132 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1544;
  undefined1 local_1540 [48];
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  long local_1498;
  Scene *local_1490;
  ulong local_1488;
  undefined1 local_1480 [32];
  float local_1450;
  float local_144c;
  float local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  uint local_1438;
  uint local_1434;
  uint local_1430;
  undefined1 local_1420 [32];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 uStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar73;
  float fVar74;
  float fVar75;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar34 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar52 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar76._8_4_ = 0x7fffffff;
    auVar76._0_8_ = 0x7fffffff7fffffff;
    auVar76._12_4_ = 0x7fffffff;
    auVar76 = vandps_avx((undefined1  [16])aVar2,auVar76);
    auVar84._8_4_ = 0x219392ef;
    auVar84._0_8_ = 0x219392ef219392ef;
    auVar84._12_4_ = 0x219392ef;
    auVar76 = vcmpps_avx(auVar76,auVar84,1);
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = 0x3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar84 = vdivps_avx(auVar85,(undefined1  [16])aVar2);
    auVar86._8_4_ = 0x5d5e0b6b;
    auVar86._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar86._12_4_ = 0x5d5e0b6b;
    auVar76 = vblendvps_avx(auVar84,auVar86,auVar76);
    auVar77._0_4_ = auVar76._0_4_ * 0.99999964;
    auVar77._4_4_ = auVar76._4_4_ * 0.99999964;
    auVar77._8_4_ = auVar76._8_4_ * 0.99999964;
    auVar77._12_4_ = auVar76._12_4_ * 0.99999964;
    auVar64._0_4_ = auVar76._0_4_ * 1.0000004;
    auVar64._4_4_ = auVar76._4_4_ * 1.0000004;
    auVar64._8_4_ = auVar76._8_4_ * 1.0000004;
    auVar64._12_4_ = auVar76._12_4_ * 1.0000004;
    uVar46 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1330._4_4_ = uVar46;
    local_1330._0_4_ = uVar46;
    local_1330._8_4_ = uVar46;
    local_1330._12_4_ = uVar46;
    auVar108 = ZEXT1664(local_1330);
    uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1340._4_4_ = uVar46;
    local_1340._0_4_ = uVar46;
    local_1340._8_4_ = uVar46;
    local_1340._12_4_ = uVar46;
    auVar115 = ZEXT1664(local_1340);
    uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1350._4_4_ = uVar46;
    local_1350._0_4_ = uVar46;
    local_1350._8_4_ = uVar46;
    local_1350._12_4_ = uVar46;
    auVar119 = ZEXT1664(local_1350);
    auVar76 = vmovshdup_avx(auVar77);
    local_1370 = vshufps_avx(auVar77,auVar77,0x55);
    auVar125 = ZEXT1664(local_1370);
    auVar84 = vshufpd_avx(auVar77,auVar77,1);
    local_1380 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar126 = ZEXT1664(local_1380);
    local_13a0 = vshufps_avx(auVar64,auVar64,0x55);
    auVar132 = ZEXT1664(local_13a0);
    uVar44 = (ulong)(auVar77._0_4_ < 0.0) * 0x10;
    uVar43 = (ulong)(auVar76._0_4_ < 0.0) << 4 | 0x20;
    local_13b0 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar140 = ZEXT1664(local_13b0);
    uVar45 = (ulong)(auVar84._0_4_ < 0.0) << 4 | 0x40;
    local_1488 = uVar44 ^ 0x10;
    uVar46 = auVar52._0_4_;
    local_13f0._4_4_ = uVar46;
    local_13f0._0_4_ = uVar46;
    local_13f0._8_4_ = uVar46;
    local_13f0._12_4_ = uVar46;
    auVar99 = ZEXT1664(local_13f0);
    uVar46 = auVar56._0_4_;
    auVar51 = ZEXT1664(CONCAT412(uVar46,CONCAT48(uVar46,CONCAT44(uVar46,uVar46))));
    local_1120._16_16_ = mm_lookupmask_ps._240_16_;
    local_1120._0_16_ = mm_lookupmask_ps._0_16_;
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar68._16_4_ = 0x3f800000;
    auVar68._20_4_ = 0x3f800000;
    auVar68._24_4_ = 0x3f800000;
    auVar68._28_4_ = 0x3f800000;
    auVar49._8_4_ = 0xbf800000;
    auVar49._0_8_ = 0xbf800000bf800000;
    auVar49._12_4_ = 0xbf800000;
    auVar49._16_4_ = 0xbf800000;
    auVar49._20_4_ = 0xbf800000;
    auVar49._24_4_ = 0xbf800000;
    auVar49._28_4_ = 0xbf800000;
    _local_1140 = vblendvps_avx(auVar68,auVar49,local_1120);
    local_1360 = auVar77._0_4_;
    fStack_135c = auVar77._0_4_;
    fStack_1358 = auVar77._0_4_;
    fStack_1354 = auVar77._0_4_;
    local_1390 = auVar64._0_4_;
    fStack_138c = auVar64._0_4_;
    fStack_1388 = auVar64._0_4_;
    fStack_1384 = auVar64._0_4_;
    fVar130 = auVar64._0_4_;
    fVar129 = auVar64._0_4_;
    fVar127 = auVar64._0_4_;
    fVar124 = auVar77._0_4_;
    fVar123 = auVar77._0_4_;
    fVar120 = auVar77._0_4_;
LAB_0192b165:
    do {
      pauVar32 = pauVar34 + -1;
      pauVar34 = pauVar34 + -1;
      if (*(float *)(*pauVar32 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar40 = *(ulong *)*pauVar34;
        while ((uVar40 & 8) == 0) {
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar44),auVar108._0_16_);
          auVar52._0_4_ = fVar120 * auVar76._0_4_;
          auVar52._4_4_ = fVar123 * auVar76._4_4_;
          auVar52._8_4_ = fVar124 * auVar76._8_4_;
          auVar52._12_4_ = auVar77._0_4_ * auVar76._12_4_;
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar43),auVar115._0_16_);
          auVar56._0_4_ = auVar125._0_4_ * auVar76._0_4_;
          auVar56._4_4_ = auVar125._4_4_ * auVar76._4_4_;
          auVar56._8_4_ = auVar125._8_4_ * auVar76._8_4_;
          auVar56._12_4_ = auVar125._12_4_ * auVar76._12_4_;
          auVar76 = vmaxps_avx(auVar52,auVar56);
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar45),auVar119._0_16_);
          auVar57._0_4_ = auVar126._0_4_ * auVar84._0_4_;
          auVar57._4_4_ = auVar126._4_4_ * auVar84._4_4_;
          auVar57._8_4_ = auVar126._8_4_ * auVar84._8_4_;
          auVar57._12_4_ = auVar126._12_4_ * auVar84._12_4_;
          auVar84 = vmaxps_avx(auVar57,auVar99._0_16_);
          local_1300 = vmaxps_avx(auVar76,auVar84);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + local_1488),auVar108._0_16_);
          auVar58._0_4_ = fVar127 * auVar76._0_4_;
          auVar58._4_4_ = fVar129 * auVar76._4_4_;
          auVar58._8_4_ = fVar130 * auVar76._8_4_;
          auVar58._12_4_ = auVar64._0_4_ * auVar76._12_4_;
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + (uVar43 ^ 0x10)),
                               auVar115._0_16_);
          auVar65._0_4_ = auVar132._0_4_ * auVar76._0_4_;
          auVar65._4_4_ = auVar132._4_4_ * auVar76._4_4_;
          auVar65._8_4_ = auVar132._8_4_ * auVar76._8_4_;
          auVar65._12_4_ = auVar132._12_4_ * auVar76._12_4_;
          auVar76 = vminps_avx(auVar58,auVar65);
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + (uVar45 ^ 0x10)),
                               auVar119._0_16_);
          auVar66._0_4_ = auVar140._0_4_ * auVar84._0_4_;
          auVar66._4_4_ = auVar140._4_4_ * auVar84._4_4_;
          auVar66._8_4_ = auVar140._8_4_ * auVar84._8_4_;
          auVar66._12_4_ = auVar140._12_4_ * auVar84._12_4_;
          auVar84 = vminps_avx(auVar66,auVar51._0_16_);
          auVar76 = vminps_avx(auVar76,auVar84);
          auVar76 = vcmpps_avx(local_1300,auVar76,2);
          uVar38 = vmovmskps_avx(auVar76);
          if (uVar38 == 0) {
            if (pauVar34 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_0192b165;
          }
          uVar38 = uVar38 & 0xff;
          uVar36 = uVar40 & 0xfffffffffffffff0;
          lVar42 = 0;
          for (uVar40 = (ulong)uVar38; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
          {
            lVar42 = lVar42 + 1;
          }
          uVar40 = *(ulong *)(uVar36 + lVar42 * 8);
          uVar38 = uVar38 - 1 & uVar38;
          uVar39 = (ulong)uVar38;
          if (uVar38 != 0) {
            uVar33 = *(uint *)(local_1300 + lVar42 * 4);
            lVar42 = 0;
            for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            uVar41 = (ulong)uVar38;
            uVar39 = *(ulong *)(uVar36 + lVar42 * 8);
            uVar3 = *(uint *)(local_1300 + lVar42 * 4);
            if (uVar38 == 0) {
              if (uVar33 < uVar3) {
                *(ulong *)*pauVar34 = uVar39;
                *(uint *)(*pauVar34 + 8) = uVar3;
                pauVar34 = pauVar34 + 1;
              }
              else {
                *(ulong *)*pauVar34 = uVar40;
                *(uint *)(*pauVar34 + 8) = uVar33;
                pauVar34 = pauVar34 + 1;
                uVar40 = uVar39;
              }
            }
            else {
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uVar40;
              auVar76 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar33));
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar39;
              auVar84 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar3));
              lVar42 = 0;
              for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                lVar42 = lVar42 + 1;
              }
              uVar38 = uVar38 - 1 & uVar38;
              uVar40 = (ulong)uVar38;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = *(ulong *)(uVar36 + lVar42 * 8);
              auVar56 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_1300 + lVar42 * 4)));
              auVar52 = vpcmpgtd_avx(auVar84,auVar76);
              if (uVar38 == 0) {
                auVar85 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar84,auVar76,auVar85);
                auVar76 = vblendvps_avx(auVar76,auVar84,auVar85);
                auVar84 = vpcmpgtd_avx(auVar56,auVar52);
                auVar85 = vpshufd_avx(auVar84,0xaa);
                auVar84 = vblendvps_avx(auVar56,auVar52,auVar85);
                auVar52 = vblendvps_avx(auVar52,auVar56,auVar85);
                auVar56 = vpcmpgtd_avx(auVar52,auVar76);
                auVar85 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar52,auVar76,auVar85);
                auVar76 = vblendvps_avx(auVar76,auVar52,auVar85);
                *pauVar34 = auVar76;
                pauVar34[1] = auVar56;
                uVar40 = auVar84._0_8_;
                pauVar34 = pauVar34 + 2;
              }
              else {
                lVar42 = 0;
                for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                  lVar42 = lVar42 + 1;
                }
                auVar87._8_8_ = 0;
                auVar87._0_8_ = *(ulong *)(uVar36 + lVar42 * 8);
                auVar86 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_1300 + lVar42 * 4)));
                auVar85 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar84,auVar76,auVar85);
                auVar76 = vblendvps_avx(auVar76,auVar84,auVar85);
                auVar84 = vpcmpgtd_avx(auVar86,auVar56);
                auVar85 = vpshufd_avx(auVar84,0xaa);
                auVar84 = vblendvps_avx(auVar86,auVar56,auVar85);
                auVar56 = vblendvps_avx(auVar56,auVar86,auVar85);
                auVar85 = vpcmpgtd_avx(auVar56,auVar76);
                auVar86 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar56,auVar76,auVar86);
                auVar76 = vblendvps_avx(auVar76,auVar56,auVar86);
                auVar56 = vpcmpgtd_avx(auVar84,auVar52);
                auVar86 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar84,auVar52,auVar86);
                auVar84 = vblendvps_avx(auVar52,auVar84,auVar86);
                auVar52 = vpcmpgtd_avx(auVar85,auVar84);
                auVar86 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar85,auVar84,auVar86);
                auVar84 = vblendvps_avx(auVar84,auVar85,auVar86);
                *pauVar34 = auVar76;
                pauVar34[1] = auVar84;
                pauVar34[2] = auVar52;
                auVar99 = ZEXT1664(local_13f0);
                uVar40 = auVar56._0_8_;
                pauVar34 = pauVar34 + 3;
              }
            }
          }
        }
        local_1498 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_1498 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          lVar42 = 0;
          do {
            lVar35 = lVar42 * 0x60;
            local_1490 = context->scene;
            ppfVar4 = (context->scene->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar40 + 0x40 + lVar35)];
            auVar60._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar40 + 0x20 + lVar35));
            auVar60._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar40 + lVar35));
            pfVar6 = ppfVar4[*(uint *)(uVar40 + 0x48 + lVar35)];
            auVar69._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar40 + 0x28 + lVar35));
            auVar69._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar40 + 8 + lVar35));
            pfVar7 = ppfVar4[*(uint *)(uVar40 + 0x44 + lVar35)];
            auVar88._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar40 + 0x24 + lVar35));
            auVar88._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar40 + 4 + lVar35));
            pfVar8 = ppfVar4[*(uint *)(uVar40 + 0x4c + lVar35)];
            auVar116._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar40 + 0x2c + lVar35));
            auVar116._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar40 + 0xc + lVar35));
            lVar1 = uVar40 + 0x40 + lVar35;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar1 = uVar40 + 0x50 + lVar35;
            local_1320 = *(undefined8 *)(lVar1 + 0x10);
            uStack_1318 = *(undefined8 *)(lVar1 + 0x18);
            auVar52 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar40 + 0x10 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar40 + 0x18 + lVar35)));
            auVar76 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar40 + 0x10 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar40 + 0x18 + lVar35)));
            auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar40 + 0x14 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar40 + 0x1c + lVar35)));
            auVar84 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar40 + 0x14 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar40 + 0x1c + lVar35)));
            auVar64 = vunpcklps_avx(auVar76,auVar84);
            auVar77 = vunpcklps_avx(auVar52,auVar56);
            auVar76 = vunpckhps_avx(auVar52,auVar56);
            auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar40 + 0x30 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar40 + 0x38 + lVar35)));
            auVar84 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar40 + 0x30 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar40 + 0x38 + lVar35)));
            auVar85 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar40 + 0x34 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar40 + 0x3c + lVar35)));
            auVar52 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar40 + 0x34 + lVar35)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar40 + 0x3c + lVar35)));
            auVar52 = vunpcklps_avx(auVar84,auVar52);
            auVar86 = vunpcklps_avx(auVar56,auVar85);
            auVar84 = vunpckhps_avx(auVar56,auVar85);
            uStack_1310 = local_1320;
            uStack_1308 = uStack_1318;
            auVar49 = vunpcklps_avx(auVar88,auVar116);
            auVar68 = vunpcklps_avx(auVar60,auVar69);
            auVar15 = vunpcklps_avx(auVar68,auVar49);
            auVar49 = vunpckhps_avx(auVar68,auVar49);
            auVar68 = vunpckhps_avx(auVar88,auVar116);
            auVar72 = vunpckhps_avx(auVar60,auVar69);
            auVar68 = vunpcklps_avx(auVar72,auVar68);
            auVar121._16_16_ = auVar77;
            auVar121._0_16_ = auVar77;
            auVar89._16_16_ = auVar76;
            auVar89._0_16_ = auVar76;
            auVar106._16_16_ = auVar64;
            auVar106._0_16_ = auVar64;
            auVar139._16_16_ = auVar86;
            auVar139._0_16_ = auVar86;
            auVar78._16_16_ = auVar84;
            auVar78._0_16_ = auVar84;
            uVar46 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar109._4_4_ = uVar46;
            auVar109._0_4_ = uVar46;
            auVar109._8_4_ = uVar46;
            auVar109._12_4_ = uVar46;
            auVar109._16_4_ = uVar46;
            auVar109._20_4_ = uVar46;
            auVar109._24_4_ = uVar46;
            auVar109._28_4_ = uVar46;
            uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar117._4_4_ = uVar46;
            auVar117._0_4_ = uVar46;
            auVar117._8_4_ = uVar46;
            auVar117._12_4_ = uVar46;
            auVar117._16_4_ = uVar46;
            auVar117._20_4_ = uVar46;
            auVar117._24_4_ = uVar46;
            auVar117._28_4_ = uVar46;
            auVar47._16_16_ = auVar52;
            auVar47._0_16_ = auVar52;
            uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar128._4_4_ = uVar46;
            auVar128._0_4_ = uVar46;
            auVar128._8_4_ = uVar46;
            auVar128._12_4_ = uVar46;
            auVar128._16_4_ = uVar46;
            auVar128._20_4_ = uVar46;
            auVar128._24_4_ = uVar46;
            auVar128._28_4_ = uVar46;
            local_1480 = vsubps_avx(auVar15,auVar109);
            local_13e0 = vsubps_avx(auVar49,auVar117);
            local_fe0 = vsubps_avx(auVar68,auVar128);
            auVar49 = vsubps_avx(auVar121,auVar109);
            auVar68 = vsubps_avx(auVar89,auVar117);
            auVar72 = vsubps_avx(auVar106,auVar128);
            auVar15 = vsubps_avx(auVar139,auVar109);
            auVar60 = vsubps_avx(auVar78,auVar117);
            auVar13 = vsubps_avx(auVar47,auVar128);
            local_1000 = vsubps_avx(auVar15,local_1480);
            local_1040 = vsubps_avx(auVar60,local_13e0);
            local_1020 = vsubps_avx(auVar13,local_fe0);
            auVar48._0_4_ = auVar15._0_4_ + local_1480._0_4_;
            auVar48._4_4_ = auVar15._4_4_ + local_1480._4_4_;
            auVar48._8_4_ = auVar15._8_4_ + local_1480._8_4_;
            auVar48._12_4_ = auVar15._12_4_ + local_1480._12_4_;
            auVar48._16_4_ = auVar15._16_4_ + local_1480._16_4_;
            auVar48._20_4_ = auVar15._20_4_ + local_1480._20_4_;
            auVar48._24_4_ = auVar15._24_4_ + local_1480._24_4_;
            auVar48._28_4_ = auVar15._28_4_ + local_1480._28_4_;
            auVar61._0_4_ = local_13e0._0_4_ + auVar60._0_4_;
            auVar61._4_4_ = local_13e0._4_4_ + auVar60._4_4_;
            auVar61._8_4_ = local_13e0._8_4_ + auVar60._8_4_;
            auVar61._12_4_ = local_13e0._12_4_ + auVar60._12_4_;
            auVar61._16_4_ = local_13e0._16_4_ + auVar60._16_4_;
            auVar61._20_4_ = local_13e0._20_4_ + auVar60._20_4_;
            auVar61._24_4_ = local_13e0._24_4_ + auVar60._24_4_;
            auVar61._28_4_ = local_13e0._28_4_ + auVar60._28_4_;
            fVar120 = local_fe0._0_4_;
            auVar79._0_4_ = auVar13._0_4_ + fVar120;
            fVar123 = local_fe0._4_4_;
            auVar79._4_4_ = auVar13._4_4_ + fVar123;
            fVar124 = local_fe0._8_4_;
            auVar79._8_4_ = auVar13._8_4_ + fVar124;
            auVar77._0_4_ = local_fe0._12_4_;
            auVar79._12_4_ = auVar13._12_4_ + auVar77._0_4_;
            fVar127 = local_fe0._16_4_;
            auVar79._16_4_ = auVar13._16_4_ + fVar127;
            fVar129 = local_fe0._20_4_;
            auVar79._20_4_ = auVar13._20_4_ + fVar129;
            fVar130 = local_fe0._24_4_;
            auVar79._24_4_ = auVar13._24_4_ + fVar130;
            auVar64._0_4_ = local_fe0._28_4_;
            auVar79._28_4_ = auVar13._28_4_ + auVar64._0_4_;
            auVar14._4_4_ = local_1020._4_4_ * auVar61._4_4_;
            auVar14._0_4_ = local_1020._0_4_ * auVar61._0_4_;
            auVar14._8_4_ = local_1020._8_4_ * auVar61._8_4_;
            auVar14._12_4_ = local_1020._12_4_ * auVar61._12_4_;
            auVar14._16_4_ = local_1020._16_4_ * auVar61._16_4_;
            auVar14._20_4_ = local_1020._20_4_ * auVar61._20_4_;
            auVar14._24_4_ = local_1020._24_4_ * auVar61._24_4_;
            auVar14._28_4_ = uVar46;
            auVar84 = vfmsub231ps_fma(auVar14,local_1040,auVar79);
            auVar16._4_4_ = local_1000._4_4_ * auVar79._4_4_;
            auVar16._0_4_ = local_1000._0_4_ * auVar79._0_4_;
            auVar16._8_4_ = local_1000._8_4_ * auVar79._8_4_;
            auVar16._12_4_ = local_1000._12_4_ * auVar79._12_4_;
            auVar16._16_4_ = local_1000._16_4_ * auVar79._16_4_;
            auVar16._20_4_ = local_1000._20_4_ * auVar79._20_4_;
            auVar16._24_4_ = local_1000._24_4_ * auVar79._24_4_;
            auVar16._28_4_ = auVar79._28_4_;
            auVar76 = vfmsub231ps_fma(auVar16,local_1020,auVar48);
            auVar17._4_4_ = auVar48._4_4_ * local_1040._4_4_;
            auVar17._0_4_ = auVar48._0_4_ * local_1040._0_4_;
            auVar17._8_4_ = auVar48._8_4_ * local_1040._8_4_;
            auVar17._12_4_ = auVar48._12_4_ * local_1040._12_4_;
            auVar17._16_4_ = auVar48._16_4_ * local_1040._16_4_;
            auVar17._20_4_ = auVar48._20_4_ * local_1040._20_4_;
            auVar17._24_4_ = auVar48._24_4_ * local_1040._24_4_;
            auVar17._28_4_ = auVar48._28_4_;
            auVar52 = vfmsub231ps_fma(auVar17,local_1000,auVar61);
            uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_1540._4_4_ = uVar46;
            local_1540._0_4_ = uVar46;
            local_1540._8_4_ = uVar46;
            local_1540._12_4_ = uVar46;
            local_1540._16_4_ = uVar46;
            local_1540._20_4_ = uVar46;
            local_1540._24_4_ = uVar46;
            local_1540._28_4_ = uVar46;
            local_14c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar18._4_4_ = (float)local_14c0._4_4_ * auVar52._4_4_;
            auVar18._0_4_ = (float)local_14c0._4_4_ * auVar52._0_4_;
            auVar18._8_4_ = (float)local_14c0._4_4_ * auVar52._8_4_;
            auVar18._12_4_ = (float)local_14c0._4_4_ * auVar52._12_4_;
            auVar18._16_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar18._20_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar18._24_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar18._28_4_ = local_1020._28_4_;
            auVar76 = vfmadd231ps_fma(auVar18,local_1540._0_32_,ZEXT1632(auVar76));
            uVar46 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar107._4_4_ = uVar46;
            auVar107._0_4_ = uVar46;
            auVar107._8_4_ = uVar46;
            auVar107._12_4_ = uVar46;
            auVar107._16_4_ = uVar46;
            auVar107._20_4_ = uVar46;
            auVar107._24_4_ = uVar46;
            auVar107._28_4_ = uVar46;
            local_1300 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar107,ZEXT1632(auVar84));
            local_1060 = vsubps_avx(local_13e0,auVar68);
            local_1080 = vsubps_avx(local_fe0,auVar72);
            auVar62._0_4_ = local_13e0._0_4_ + auVar68._0_4_;
            auVar62._4_4_ = local_13e0._4_4_ + auVar68._4_4_;
            auVar62._8_4_ = local_13e0._8_4_ + auVar68._8_4_;
            auVar62._12_4_ = local_13e0._12_4_ + auVar68._12_4_;
            auVar62._16_4_ = local_13e0._16_4_ + auVar68._16_4_;
            auVar62._20_4_ = local_13e0._20_4_ + auVar68._20_4_;
            auVar62._24_4_ = local_13e0._24_4_ + auVar68._24_4_;
            auVar62._28_4_ = local_13e0._28_4_ + auVar68._28_4_;
            auVar80._0_4_ = auVar72._0_4_ + fVar120;
            auVar80._4_4_ = auVar72._4_4_ + fVar123;
            auVar80._8_4_ = auVar72._8_4_ + fVar124;
            auVar80._12_4_ = auVar72._12_4_ + auVar77._0_4_;
            auVar80._16_4_ = auVar72._16_4_ + fVar127;
            auVar80._20_4_ = auVar72._20_4_ + fVar129;
            auVar80._24_4_ = auVar72._24_4_ + fVar130;
            auVar80._28_4_ = auVar72._28_4_ + auVar64._0_4_;
            fVar73 = local_1080._0_4_;
            fVar74 = local_1080._4_4_;
            auVar19._4_4_ = auVar62._4_4_ * fVar74;
            auVar19._0_4_ = auVar62._0_4_ * fVar73;
            fVar83 = local_1080._8_4_;
            auVar19._8_4_ = auVar62._8_4_ * fVar83;
            fVar92 = local_1080._12_4_;
            auVar19._12_4_ = auVar62._12_4_ * fVar92;
            fVar94 = local_1080._16_4_;
            auVar19._16_4_ = auVar62._16_4_ * fVar94;
            fVar96 = local_1080._20_4_;
            auVar19._20_4_ = auVar62._20_4_ * fVar96;
            fVar11 = local_1080._24_4_;
            auVar19._24_4_ = auVar62._24_4_ * fVar11;
            auVar19._28_4_ = auVar64._0_4_;
            auVar84 = vfmsub231ps_fma(auVar19,local_1060,auVar80);
            local_10a0 = vsubps_avx(local_1480,auVar49);
            fVar131 = local_10a0._0_4_;
            fVar133 = local_10a0._4_4_;
            auVar20._4_4_ = fVar133 * auVar80._4_4_;
            auVar20._0_4_ = fVar131 * auVar80._0_4_;
            fVar134 = local_10a0._8_4_;
            auVar20._8_4_ = fVar134 * auVar80._8_4_;
            fVar135 = local_10a0._12_4_;
            auVar20._12_4_ = fVar135 * auVar80._12_4_;
            fVar136 = local_10a0._16_4_;
            auVar20._16_4_ = fVar136 * auVar80._16_4_;
            fVar137 = local_10a0._20_4_;
            auVar20._20_4_ = fVar137 * auVar80._20_4_;
            fVar138 = local_10a0._24_4_;
            auVar20._24_4_ = fVar138 * auVar80._24_4_;
            auVar20._28_4_ = auVar80._28_4_;
            auVar110._0_4_ = local_1480._0_4_ + auVar49._0_4_;
            auVar110._4_4_ = local_1480._4_4_ + auVar49._4_4_;
            auVar110._8_4_ = local_1480._8_4_ + auVar49._8_4_;
            auVar110._12_4_ = local_1480._12_4_ + auVar49._12_4_;
            auVar110._16_4_ = local_1480._16_4_ + auVar49._16_4_;
            auVar110._20_4_ = local_1480._20_4_ + auVar49._20_4_;
            auVar110._24_4_ = local_1480._24_4_ + auVar49._24_4_;
            auVar110._28_4_ = local_1480._28_4_ + auVar49._28_4_;
            auVar76 = vfmsub231ps_fma(auVar20,local_1080,auVar110);
            auVar64._0_4_ = local_1060._0_4_;
            fVar75 = local_1060._4_4_;
            auVar21._4_4_ = auVar110._4_4_ * fVar75;
            auVar21._0_4_ = auVar110._0_4_ * auVar64._0_4_;
            fVar91 = local_1060._8_4_;
            auVar21._8_4_ = auVar110._8_4_ * fVar91;
            fVar93 = local_1060._12_4_;
            auVar21._12_4_ = auVar110._12_4_ * fVar93;
            fVar95 = local_1060._16_4_;
            auVar21._16_4_ = auVar110._16_4_ * fVar95;
            fVar10 = local_1060._20_4_;
            auVar21._20_4_ = auVar110._20_4_ * fVar10;
            fVar12 = local_1060._24_4_;
            auVar21._24_4_ = auVar110._24_4_ * fVar12;
            auVar21._28_4_ = auVar110._28_4_;
            auVar52 = vfmsub231ps_fma(auVar21,local_10a0,auVar62);
            auVar22._4_4_ = (float)local_14c0._4_4_ * auVar52._4_4_;
            auVar22._0_4_ = (float)local_14c0._4_4_ * auVar52._0_4_;
            auVar22._8_4_ = (float)local_14c0._4_4_ * auVar52._8_4_;
            auVar22._12_4_ = (float)local_14c0._4_4_ * auVar52._12_4_;
            auVar22._16_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar22._20_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar22._24_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar22._28_4_ = auVar62._28_4_;
            auVar76 = vfmadd231ps_fma(auVar22,local_1540._0_32_,ZEXT1632(auVar76));
            auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar107,ZEXT1632(auVar84));
            auVar14 = vsubps_avx(auVar49,auVar15);
            auVar70._0_4_ = auVar15._0_4_ + auVar49._0_4_;
            auVar70._4_4_ = auVar15._4_4_ + auVar49._4_4_;
            auVar70._8_4_ = auVar15._8_4_ + auVar49._8_4_;
            auVar70._12_4_ = auVar15._12_4_ + auVar49._12_4_;
            auVar70._16_4_ = auVar15._16_4_ + auVar49._16_4_;
            auVar70._20_4_ = auVar15._20_4_ + auVar49._20_4_;
            auVar70._24_4_ = auVar15._24_4_ + auVar49._24_4_;
            auVar70._28_4_ = auVar15._28_4_ + auVar49._28_4_;
            auVar15 = vsubps_avx(auVar68,auVar60);
            auVar90._0_4_ = auVar68._0_4_ + auVar60._0_4_;
            auVar90._4_4_ = auVar68._4_4_ + auVar60._4_4_;
            auVar90._8_4_ = auVar68._8_4_ + auVar60._8_4_;
            auVar90._12_4_ = auVar68._12_4_ + auVar60._12_4_;
            auVar90._16_4_ = auVar68._16_4_ + auVar60._16_4_;
            auVar90._20_4_ = auVar68._20_4_ + auVar60._20_4_;
            auVar90._24_4_ = auVar68._24_4_ + auVar60._24_4_;
            auVar90._28_4_ = auVar68._28_4_ + auVar60._28_4_;
            auVar60 = vsubps_avx(auVar72,auVar13);
            auVar54._0_4_ = auVar72._0_4_ + auVar13._0_4_;
            auVar54._4_4_ = auVar72._4_4_ + auVar13._4_4_;
            auVar54._8_4_ = auVar72._8_4_ + auVar13._8_4_;
            auVar54._12_4_ = auVar72._12_4_ + auVar13._12_4_;
            auVar54._16_4_ = auVar72._16_4_ + auVar13._16_4_;
            auVar54._20_4_ = auVar72._20_4_ + auVar13._20_4_;
            auVar54._24_4_ = auVar72._24_4_ + auVar13._24_4_;
            auVar54._28_4_ = auVar72._28_4_ + auVar13._28_4_;
            auVar98._0_4_ = auVar60._0_4_ * auVar90._0_4_;
            auVar98._4_4_ = auVar60._4_4_ * auVar90._4_4_;
            auVar98._8_4_ = auVar60._8_4_ * auVar90._8_4_;
            auVar98._12_4_ = auVar60._12_4_ * auVar90._12_4_;
            auVar98._16_4_ = auVar60._16_4_ * auVar90._16_4_;
            auVar98._20_4_ = auVar60._20_4_ * auVar90._20_4_;
            auVar98._24_4_ = auVar60._24_4_ * auVar90._24_4_;
            auVar98._28_4_ = 0;
            auVar52 = vfmsub231ps_fma(auVar98,auVar15,auVar54);
            auVar72._4_4_ = auVar54._4_4_ * auVar14._4_4_;
            auVar72._0_4_ = auVar54._0_4_ * auVar14._0_4_;
            auVar72._8_4_ = auVar54._8_4_ * auVar14._8_4_;
            auVar72._12_4_ = auVar54._12_4_ * auVar14._12_4_;
            auVar72._16_4_ = auVar54._16_4_ * auVar14._16_4_;
            auVar72._20_4_ = auVar54._20_4_ * auVar14._20_4_;
            auVar72._24_4_ = auVar54._24_4_ * auVar14._24_4_;
            auVar72._28_4_ = auVar54._28_4_;
            auVar84 = vfmsub231ps_fma(auVar72,auVar60,auVar70);
            auVar13._4_4_ = auVar15._4_4_ * auVar70._4_4_;
            auVar13._0_4_ = auVar15._0_4_ * auVar70._0_4_;
            auVar13._8_4_ = auVar15._8_4_ * auVar70._8_4_;
            auVar13._12_4_ = auVar15._12_4_ * auVar70._12_4_;
            auVar13._16_4_ = auVar15._16_4_ * auVar70._16_4_;
            auVar13._20_4_ = auVar15._20_4_ * auVar70._20_4_;
            auVar13._24_4_ = auVar15._24_4_ * auVar70._24_4_;
            auVar13._28_4_ = auVar70._28_4_;
            auVar56 = vfmsub231ps_fma(auVar13,auVar14,auVar90);
            local_14c0._0_4_ = local_14c0._4_4_;
            fStack_14b8 = (float)local_14c0._4_4_;
            fStack_14b4 = (float)local_14c0._4_4_;
            fStack_14b0 = (float)local_14c0._4_4_;
            fStack_14ac = (float)local_14c0._4_4_;
            fStack_14a8 = (float)local_14c0._4_4_;
            fStack_14a4 = (float)local_14c0._4_4_;
            auVar71._0_4_ = (float)local_14c0._4_4_ * auVar56._0_4_;
            auVar71._4_4_ = (float)local_14c0._4_4_ * auVar56._4_4_;
            auVar71._8_4_ = (float)local_14c0._4_4_ * auVar56._8_4_;
            auVar71._12_4_ = (float)local_14c0._4_4_ * auVar56._12_4_;
            auVar71._16_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar71._20_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar71._24_4_ = (float)local_14c0._4_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar84 = vfmadd231ps_fma(auVar71,local_1540._0_32_,ZEXT1632(auVar84));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar107,ZEXT1632(auVar52));
            local_12c0 = ZEXT1632(CONCAT412(auVar84._12_4_ + local_1300._12_4_ + auVar76._12_4_,
                                            CONCAT48(auVar84._8_4_ +
                                                     local_1300._8_4_ + auVar76._8_4_,
                                                     CONCAT44(auVar84._4_4_ +
                                                              local_1300._4_4_ + auVar76._4_4_,
                                                              auVar84._0_4_ +
                                                              local_1300._0_4_ + auVar76._0_4_))));
            auVar55._8_4_ = 0x7fffffff;
            auVar55._0_8_ = 0x7fffffff7fffffff;
            auVar55._12_4_ = 0x7fffffff;
            auVar55._16_4_ = 0x7fffffff;
            auVar55._20_4_ = 0x7fffffff;
            auVar55._24_4_ = 0x7fffffff;
            auVar55._28_4_ = 0x7fffffff;
            local_14e0 = ZEXT1632(local_1300);
            auVar49 = vminps_avx(local_14e0,ZEXT1632(auVar76));
            auVar49 = vminps_avx(auVar49,ZEXT1632(auVar84));
            local_10e0 = vandps_avx(local_12c0,auVar55);
            fVar97 = local_10e0._0_4_ * 1.1920929e-07;
            fVar100 = local_10e0._4_4_ * 1.1920929e-07;
            auVar23._4_4_ = fVar100;
            auVar23._0_4_ = fVar97;
            fVar101 = local_10e0._8_4_ * 1.1920929e-07;
            auVar23._8_4_ = fVar101;
            fVar102 = local_10e0._12_4_ * 1.1920929e-07;
            auVar23._12_4_ = fVar102;
            fVar103 = local_10e0._16_4_ * 1.1920929e-07;
            auVar23._16_4_ = fVar103;
            fVar104 = local_10e0._20_4_ * 1.1920929e-07;
            auVar23._20_4_ = fVar104;
            fVar105 = local_10e0._24_4_ * 1.1920929e-07;
            auVar23._24_4_ = fVar105;
            auVar23._28_4_ = 0x34000000;
            auVar111._0_8_ = CONCAT44(fVar100,fVar97) ^ 0x8000000080000000;
            auVar111._8_4_ = -fVar101;
            auVar111._12_4_ = -fVar102;
            auVar111._16_4_ = -fVar103;
            auVar111._20_4_ = -fVar104;
            auVar111._24_4_ = -fVar105;
            auVar111._28_4_ = 0xb4000000;
            auVar49 = vcmpps_avx(auVar49,auVar111,5);
            local_10c0 = ZEXT1632(auVar76);
            auVar72 = vmaxps_avx(local_14e0,local_10c0);
            auVar68 = vmaxps_avx(auVar72,ZEXT1632(auVar84));
            auVar68 = vcmpps_avx(auVar68,auVar23,2);
            auVar68 = vorps_avx(auVar49,auVar68);
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              local_1100 = 0x80000000;
              uStack_10fc = 0x80000000;
              uStack_10f8 = 0x80000000;
              uStack_10f4 = 0x80000000;
              uStack_10f0 = 0x80000000;
              uStack_10ec = 0x80000000;
              uStack_10e8 = 0x80000000;
              uStack_10e4 = 0x80000000;
              auVar24._4_4_ = fVar75 * local_1020._4_4_;
              auVar24._0_4_ = auVar64._0_4_ * local_1020._0_4_;
              auVar24._8_4_ = fVar91 * local_1020._8_4_;
              auVar24._12_4_ = fVar93 * local_1020._12_4_;
              auVar24._16_4_ = fVar95 * local_1020._16_4_;
              auVar24._20_4_ = fVar10 * local_1020._20_4_;
              auVar24._24_4_ = fVar12 * local_1020._24_4_;
              auVar24._28_4_ = auVar49._28_4_;
              auVar25._4_4_ = local_1040._4_4_ * fVar133;
              auVar25._0_4_ = local_1040._0_4_ * fVar131;
              auVar25._8_4_ = local_1040._8_4_ * fVar134;
              auVar25._12_4_ = local_1040._12_4_ * fVar135;
              auVar25._16_4_ = local_1040._16_4_ * fVar136;
              auVar25._20_4_ = local_1040._20_4_ * fVar137;
              auVar25._24_4_ = local_1040._24_4_ * fVar138;
              auVar25._28_4_ = auVar72._28_4_;
              auVar84 = vfmsub213ps_fma(local_1040,local_1080,auVar24);
              auVar26._4_4_ = fVar74 * auVar15._4_4_;
              auVar26._0_4_ = fVar73 * auVar15._0_4_;
              auVar26._8_4_ = fVar83 * auVar15._8_4_;
              auVar26._12_4_ = fVar92 * auVar15._12_4_;
              auVar26._16_4_ = fVar94 * auVar15._16_4_;
              auVar26._20_4_ = fVar96 * auVar15._20_4_;
              auVar26._24_4_ = fVar11 * auVar15._24_4_;
              auVar26._28_4_ = 0x34000000;
              auVar118._0_4_ = fVar131 * auVar60._0_4_;
              auVar118._4_4_ = fVar133 * auVar60._4_4_;
              auVar118._8_4_ = fVar134 * auVar60._8_4_;
              auVar118._12_4_ = fVar135 * auVar60._12_4_;
              auVar118._16_4_ = fVar136 * auVar60._16_4_;
              auVar118._20_4_ = fVar137 * auVar60._20_4_;
              auVar118._24_4_ = fVar138 * auVar60._24_4_;
              auVar118._28_4_ = 0;
              auVar52 = vfmsub213ps_fma(auVar60,local_1060,auVar26);
              auVar49 = vandps_avx(auVar24,auVar55);
              auVar72 = vandps_avx(auVar26,auVar55);
              auVar49 = vcmpps_avx(auVar49,auVar72,1);
              local_12a0 = vblendvps_avx(ZEXT1632(auVar52),ZEXT1632(auVar84),auVar49);
              auVar27._4_4_ = fVar75 * auVar14._4_4_;
              auVar27._0_4_ = auVar64._0_4_ * auVar14._0_4_;
              auVar27._8_4_ = fVar91 * auVar14._8_4_;
              auVar27._12_4_ = fVar93 * auVar14._12_4_;
              auVar27._16_4_ = fVar95 * auVar14._16_4_;
              auVar27._20_4_ = fVar10 * auVar14._20_4_;
              auVar27._24_4_ = fVar12 * auVar14._24_4_;
              auVar27._28_4_ = auVar49._28_4_;
              auVar84 = vfmsub213ps_fma(auVar14,local_1080,auVar118);
              auVar28._4_4_ = local_1000._4_4_ * fVar74;
              auVar28._0_4_ = local_1000._0_4_ * fVar73;
              auVar28._8_4_ = local_1000._8_4_ * fVar83;
              auVar28._12_4_ = local_1000._12_4_ * fVar92;
              auVar28._16_4_ = local_1000._16_4_ * fVar94;
              auVar28._20_4_ = local_1000._20_4_ * fVar96;
              auVar28._24_4_ = local_1000._24_4_ * fVar11;
              auVar28._28_4_ = auVar72._28_4_;
              auVar52 = vfmsub213ps_fma(local_1020,local_10a0,auVar28);
              auVar49 = vandps_avx(auVar28,auVar55);
              auVar72 = vandps_avx(auVar118,auVar55);
              auVar49 = vcmpps_avx(auVar49,auVar72,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar52),auVar49);
              auVar84 = vfmsub213ps_fma(local_1000,local_1060,auVar25);
              auVar52 = vfmsub213ps_fma(auVar15,local_10a0,auVar27);
              auVar49 = vandps_avx(auVar25,auVar55);
              auVar72 = vandps_avx(auVar27,auVar55);
              auVar72 = vcmpps_avx(auVar49,auVar72,1);
              local_1260 = vblendvps_avx(ZEXT1632(auVar52),ZEXT1632(auVar84),auVar72);
              auVar84 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
              fVar83 = local_1260._0_4_;
              fVar91 = local_1260._4_4_;
              auVar15._4_4_ = fVar91 * (float)local_14c0._4_4_;
              auVar15._0_4_ = fVar83 * (float)local_14c0._4_4_;
              fVar92 = local_1260._8_4_;
              auVar15._8_4_ = fVar92 * (float)local_14c0._4_4_;
              fVar93 = local_1260._12_4_;
              auVar15._12_4_ = fVar93 * (float)local_14c0._4_4_;
              fVar94 = local_1260._16_4_;
              auVar15._16_4_ = fVar94 * (float)local_14c0._4_4_;
              fVar95 = local_1260._20_4_;
              auVar15._20_4_ = fVar95 * (float)local_14c0._4_4_;
              fVar96 = local_1260._24_4_;
              auVar15._24_4_ = fVar96 * (float)local_14c0._4_4_;
              auVar15._28_4_ = auVar68._28_4_;
              auVar52 = vfmadd213ps_fma(local_1540._0_32_,local_1280,auVar15);
              auVar52 = vfmadd213ps_fma(auVar107,local_12a0,ZEXT1632(auVar52));
              auVar64._0_4_ = auVar52._0_4_ + auVar52._0_4_;
              fVar73 = auVar52._4_4_ + auVar52._4_4_;
              fVar74 = auVar52._8_4_ + auVar52._8_4_;
              fVar75 = auVar52._12_4_ + auVar52._12_4_;
              auVar72 = ZEXT1632(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(fVar73,auVar64._0_4_))));
              auVar29._4_4_ = fVar91 * fVar123;
              auVar29._0_4_ = fVar83 * fVar120;
              auVar29._8_4_ = fVar92 * fVar124;
              auVar29._12_4_ = fVar93 * auVar77._0_4_;
              auVar29._16_4_ = fVar94 * fVar127;
              auVar29._20_4_ = fVar95 * fVar129;
              auVar29._24_4_ = fVar96 * fVar130;
              auVar29._28_4_ = auVar49._28_4_;
              auVar52 = vfmadd213ps_fma(local_13e0,local_1280,auVar29);
              auVar56 = vfmadd213ps_fma(local_1480,local_12a0,ZEXT1632(auVar52));
              auVar49 = vrcpps_avx(auVar72);
              auVar122._8_4_ = 0x3f800000;
              auVar122._0_8_ = 0x3f8000003f800000;
              auVar122._12_4_ = 0x3f800000;
              auVar122._16_4_ = 0x3f800000;
              auVar122._20_4_ = 0x3f800000;
              auVar122._24_4_ = 0x3f800000;
              auVar122._28_4_ = 0x3f800000;
              auVar52 = vfnmadd213ps_fma(auVar49,auVar72,auVar122);
              auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar49,auVar49);
              _local_14c0 = ZEXT1632(CONCAT412((auVar56._12_4_ + auVar56._12_4_) * auVar52._12_4_,
                                               CONCAT48((auVar56._8_4_ + auVar56._8_4_) *
                                                        auVar52._8_4_,
                                                        CONCAT44((auVar56._4_4_ + auVar56._4_4_) *
                                                                 auVar52._4_4_,
                                                                 (auVar56._0_4_ + auVar56._0_4_) *
                                                                 auVar52._0_4_))));
              uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar81._4_4_ = uVar46;
              auVar81._0_4_ = uVar46;
              auVar81._8_4_ = uVar46;
              auVar81._12_4_ = uVar46;
              auVar81._16_4_ = uVar46;
              auVar81._20_4_ = uVar46;
              auVar81._24_4_ = uVar46;
              auVar81._28_4_ = uVar46;
              auVar49 = vcmpps_avx(auVar81,_local_14c0,2);
              fVar120 = (ray->super_RayK<1>).tfar;
              auVar112._4_4_ = fVar120;
              auVar112._0_4_ = fVar120;
              auVar112._8_4_ = fVar120;
              auVar112._12_4_ = fVar120;
              auVar112._16_4_ = fVar120;
              auVar112._20_4_ = fVar120;
              auVar112._24_4_ = fVar120;
              auVar112._28_4_ = fVar120;
              auVar68 = vcmpps_avx(_local_14c0,auVar112,2);
              auVar49 = vandps_avx(auVar68,auVar49);
              auVar113._0_8_ = CONCAT44(fVar73,auVar64._0_4_) ^ 0x8000000080000000;
              auVar113._8_4_ = -fVar74;
              auVar113._12_4_ = -fVar75;
              auVar113._16_4_ = 0x80000000;
              auVar113._20_4_ = 0x80000000;
              auVar113._24_4_ = 0x80000000;
              auVar113._28_4_ = 0x80000000;
              auVar68 = vcmpps_avx(auVar113,auVar72,4);
              auVar49 = vandps_avx(auVar49,auVar68);
              auVar52 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
              auVar84 = vpand_avx(auVar52,auVar84);
              local_1240 = vpmovsxwd_avx2(auVar84);
              if ((((((((local_1240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1240 >> 0x7f,0) != '\0') ||
                    (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1240 >> 0xbf,0) != '\0') ||
                  (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1240[0x1f] < '\0') {
                uStack_12f0 = 0;
                uStack_12ec = 0;
                uStack_12e8 = 0;
                uStack_12e4 = 0;
                local_12e0 = local_10c0;
                auVar49 = vrcpps_avx(local_12c0);
                auVar114._8_4_ = 0x3f800000;
                auVar114._0_8_ = 0x3f8000003f800000;
                auVar114._12_4_ = 0x3f800000;
                auVar114._16_4_ = 0x3f800000;
                auVar114._20_4_ = 0x3f800000;
                auVar114._24_4_ = 0x3f800000;
                auVar114._28_4_ = 0x3f800000;
                auVar52 = vfnmadd213ps_fma(local_12c0,auVar49,auVar114);
                auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar49,auVar49);
                auVar82._8_4_ = 0x219392ef;
                auVar82._0_8_ = 0x219392ef219392ef;
                auVar82._12_4_ = 0x219392ef;
                auVar82._16_4_ = 0x219392ef;
                auVar82._20_4_ = 0x219392ef;
                auVar82._24_4_ = 0x219392ef;
                auVar82._28_4_ = 0x219392ef;
                auVar49 = vcmpps_avx(local_10e0,auVar82,5);
                auVar49 = vandps_avx(auVar49,ZEXT1632(auVar52));
                local_11e0 = _local_14c0;
                local_1160 = local_1120;
                auVar30._4_4_ = local_1300._4_4_ * auVar49._4_4_;
                auVar30._0_4_ = local_1300._0_4_ * auVar49._0_4_;
                auVar30._8_4_ = local_1300._8_4_ * auVar49._8_4_;
                auVar30._12_4_ = local_1300._12_4_ * auVar49._12_4_;
                auVar30._16_4_ = auVar49._16_4_ * 0.0;
                auVar30._20_4_ = auVar49._20_4_ * 0.0;
                auVar30._24_4_ = auVar49._24_4_ * 0.0;
                auVar30._28_4_ = 0;
                auVar68 = vminps_avx(auVar30,auVar114);
                auVar31._4_4_ = auVar76._4_4_ * auVar49._4_4_;
                auVar31._0_4_ = auVar76._0_4_ * auVar49._0_4_;
                auVar31._8_4_ = auVar76._8_4_ * auVar49._8_4_;
                auVar31._12_4_ = auVar76._12_4_ * auVar49._12_4_;
                auVar31._16_4_ = auVar49._16_4_ * 0.0;
                auVar31._20_4_ = auVar49._20_4_ * 0.0;
                auVar31._24_4_ = auVar49._24_4_ * 0.0;
                auVar31._28_4_ = 0;
                auVar49 = vminps_avx(auVar31,auVar114);
                auVar72 = vsubps_avx(auVar114,auVar68);
                local_1200 = vblendvps_avx(auVar49,auVar72,local_1120);
                auVar49 = vsubps_avx(auVar114,auVar49);
                local_1220 = vblendvps_avx(auVar68,auVar49,local_1120);
                local_11c0[0] = local_12a0._0_4_ * (float)local_1140._0_4_;
                local_11c0[1] = local_12a0._4_4_ * (float)local_1140._4_4_;
                local_11c0[2] = local_12a0._8_4_ * fStack_1138;
                local_11c0[3] = local_12a0._12_4_ * fStack_1134;
                fStack_11b0 = local_12a0._16_4_ * fStack_1130;
                fStack_11ac = local_12a0._20_4_ * fStack_112c;
                fStack_11a8 = local_12a0._24_4_ * fStack_1128;
                uStack_11a4 = local_1220._28_4_;
                local_11a0[0] = (float)local_1140._0_4_ * local_1280._0_4_;
                local_11a0[1] = (float)local_1140._4_4_ * local_1280._4_4_;
                local_11a0[2] = fStack_1138 * local_1280._8_4_;
                local_11a0[3] = fStack_1134 * local_1280._12_4_;
                fStack_1190 = fStack_1130 * local_1280._16_4_;
                fStack_118c = fStack_112c * local_1280._20_4_;
                fStack_1188 = fStack_1128 * local_1280._24_4_;
                uStack_1184 = auVar49._28_4_;
                auVar49 = vpmovzxwd_avx2(auVar84);
                auVar49 = vpslld_avx2(auVar49,0x1f);
                auVar63._8_4_ = 0x7f800000;
                auVar63._0_8_ = 0x7f8000007f800000;
                auVar63._12_4_ = 0x7f800000;
                auVar63._16_4_ = 0x7f800000;
                auVar63._20_4_ = 0x7f800000;
                auVar63._24_4_ = 0x7f800000;
                auVar63._28_4_ = 0x7f800000;
                auVar49 = vblendvps_avx(auVar63,_local_14c0,auVar49);
                local_1180[0] = (float)local_1140._0_4_ * fVar83;
                local_1180[1] = (float)local_1140._4_4_ * fVar91;
                local_1180[2] = fStack_1138 * fVar92;
                local_1180[3] = fStack_1134 * fVar93;
                fStack_1170 = fStack_1130 * fVar94;
                fStack_116c = fStack_112c * fVar95;
                fStack_1168 = fStack_1128 * fVar96;
                uStack_1164 = uStack_1124;
                auVar68 = vshufps_avx(auVar49,auVar49,0xb1);
                auVar68 = vminps_avx(auVar49,auVar68);
                auVar72 = vshufpd_avx(auVar68,auVar68,5);
                auVar68 = vminps_avx(auVar68,auVar72);
                auVar72 = vpermpd_avx2(auVar68,0x4e);
                auVar68 = vminps_avx(auVar68,auVar72);
                auVar49 = vcmpps_avx(auVar49,auVar68,0);
                auVar76 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
                auVar76 = vpand_avx(auVar76,auVar84);
                local_14e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                local_1420 = local_1240;
                auVar49 = vpmovzxwd_avx2(auVar76);
                auVar49 = vpslld_avx2(auVar49,0x1f);
                if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar49 >> 0x7f,0) == '\0') &&
                      (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar49 >> 0xbf,0) == '\0') &&
                    (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar49[0x1f]) {
                  auVar49 = local_1240;
                }
                uVar46 = vextractps_avx(local_14e0._0_16_,1);
                local_1540._0_4_ = uVar46;
                uVar33 = vmovmskps_avx(auVar49);
                uVar38 = 0;
                for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                  uVar38 = uVar38 + 1;
                }
                do {
                  uVar36 = CONCAT44(0,uVar38);
                  uVar38 = *(uint *)((long)&local_fc0 + uVar36 * 4);
                  pGVar9 = (local_1490->geometries).items[uVar38].ptr;
                  if ((pGVar9->mask & local_1540._0_4_) == 0) {
                    *(undefined4 *)(local_1420 + uVar36 * 4) = 0;
                    uVar38 = local_1540._0_4_;
                  }
                  else {
                    local_1540._0_8_ = context->args;
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar37 = context->user;
                      if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar120 = *(float *)(local_1220 + uVar36 * 4);
                        fVar123 = *(float *)(local_1200 + uVar36 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar36 * 4);
                        (ray->Ng).field_0.field_0.x = local_11c0[uVar36];
                        (ray->Ng).field_0.field_0.y = local_11a0[uVar36];
                        (ray->Ng).field_0.field_0.z = local_1180[uVar36];
                        ray->u = fVar120;
                        ray->v = fVar123;
                        ray->primID = *(uint *)((long)&local_1320 + uVar36 * 4);
                        ray->geomID = uVar38;
                        ray->instID[0] = pRVar37->instID[0];
                        ray->instPrimID[0] = pRVar37->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar37 = context->user;
                    }
                    local_1450 = local_11c0[uVar36];
                    local_144c = local_11a0[uVar36];
                    local_1448 = local_1180[uVar36];
                    local_1444 = *(undefined4 *)(local_1220 + uVar36 * 4);
                    local_1440 = *(undefined4 *)(local_1200 + uVar36 * 4);
                    local_143c = *(undefined4 *)((long)&local_1320 + uVar36 * 4);
                    local_1438 = uVar38;
                    local_1434 = pRVar37->instID[0];
                    local_1430 = pRVar37->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar36 * 4);
                    local_1544 = -1;
                    local_1510.valid = &local_1544;
                    local_1510.geometryUserPtr = pGVar9->userPtr;
                    local_1510.context = pRVar37;
                    local_1510.ray = (RTCRayN *)ray;
                    local_1510.hit = (RTCHitN *)&local_1450;
                    local_1510.N = 1;
                    local_1480._0_8_ = pGVar9;
                    local_13e0._0_8_ = uVar36;
                    if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0192bcef:
                      if ((*(code **)(local_1540._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_1540._0_8_ & 2) != 0 ||
                          ((*(byte *)(local_1480._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_1540._0_8_ + 0x10))(&local_1510);
                        uVar36 = local_13e0._0_8_;
                        if (*local_1510.valid == 0) goto LAB_0192bdae;
                      }
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1510.hit;
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1510.hit + 4);
                      (((Vec3f *)((long)local_1510.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1510.hit + 8);
                      *(float *)((long)local_1510.ray + 0x3c) = *(float *)(local_1510.hit + 0xc);
                      *(float *)((long)local_1510.ray + 0x40) = *(float *)(local_1510.hit + 0x10);
                      *(float *)((long)local_1510.ray + 0x44) = *(float *)(local_1510.hit + 0x14);
                      *(float *)((long)local_1510.ray + 0x48) = *(float *)(local_1510.hit + 0x18);
                      *(float *)((long)local_1510.ray + 0x4c) = *(float *)(local_1510.hit + 0x1c);
                      *(float *)((long)local_1510.ray + 0x50) = *(float *)(local_1510.hit + 0x20);
                    }
                    else {
                      (*pGVar9->intersectionFilterN)(&local_1510);
                      uVar36 = local_13e0._0_8_;
                      if (*local_1510.valid != 0) goto LAB_0192bcef;
LAB_0192bdae:
                      (ray->super_RayK<1>).tfar = (float)local_14e0._0_4_;
                      uVar36 = local_13e0._0_8_;
                    }
                    fVar120 = (ray->super_RayK<1>).tfar;
                    auVar50._4_4_ = fVar120;
                    auVar50._0_4_ = fVar120;
                    auVar50._8_4_ = fVar120;
                    auVar50._12_4_ = fVar120;
                    auVar50._16_4_ = fVar120;
                    auVar50._20_4_ = fVar120;
                    auVar50._24_4_ = fVar120;
                    auVar50._28_4_ = fVar120;
                    *(undefined4 *)(local_1420 + uVar36 * 4) = 0;
                    auVar49 = vcmpps_avx(_local_14c0,auVar50,2);
                    local_1420 = vandps_avx(auVar49,local_1420);
                    local_14e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    uVar38 = (ray->super_RayK<1>).mask;
                  }
                  if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1420 >> 0x7f,0) == '\0') &&
                        (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1420 >> 0xbf,0) == '\0') &&
                      (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1420[0x1f]) break;
                  local_1540._0_4_ = uVar38;
                  BVHNIntersector1<4,1,true,embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1510);
                  uVar38 = (uint)local_1510.valid;
                } while( true );
              }
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != local_1498);
        }
        fVar120 = (ray->super_RayK<1>).tfar;
        auVar51 = ZEXT1664(CONCAT412(fVar120,CONCAT48(fVar120,CONCAT44(fVar120,fVar120))));
        auVar108 = ZEXT1664(local_1330);
        auVar115 = ZEXT1664(local_1340);
        auVar119 = ZEXT1664(local_1350);
        auVar125 = ZEXT1664(local_1370);
        auVar126 = ZEXT1664(local_1380);
        auVar132 = ZEXT1664(local_13a0);
        auVar140 = ZEXT1664(local_13b0);
        auVar99 = ZEXT1664(local_13f0);
        fVar120 = local_1360;
        fVar123 = fStack_135c;
        fVar124 = fStack_1358;
        auVar77._0_4_ = fStack_1354;
        fVar127 = local_1390;
        fVar129 = fStack_138c;
        fVar130 = fStack_1388;
        auVar64._0_4_ = fStack_1384;
      }
    } while (pauVar34 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }